

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O2

drwav_uint16 drwav_fmt_get_format(drwav_fmt *pFMT)

{
  drwav_uint16 dVar1;
  
  if (pFMT != (drwav_fmt *)0x0) {
    dVar1 = pFMT->formatTag;
    if (dVar1 == 0xfffe) {
      dVar1 = *(drwav_uint16 *)pFMT->subFormat;
    }
    return dVar1;
  }
  return 0;
}

Assistant:

DRWAV_API drwav_uint16 drwav_fmt_get_format(const drwav_fmt* pFMT)
{
    if (pFMT == NULL) {
        return 0;
    }

    if (pFMT->formatTag != DR_WAVE_FORMAT_EXTENSIBLE) {
        return pFMT->formatTag;
    } else {
        return drwav__bytes_to_u16(pFMT->subFormat);    /* Only the first two bytes are required. */
    }
}